

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibTable.cpp
# Opt level: O0

int lib::table::Remove(State *state)

{
  bool bVar1;
  Table *this;
  StackAPI *this_00;
  State *in_RDI;
  double dVar2;
  int params;
  size_t index;
  Table *table;
  StackAPI api;
  ValueT in_stack_ffffffffffffffcc;
  undefined1 uVar3;
  Table *in_stack_ffffffffffffffd0;
  StackAPI *in_stack_ffffffffffffffd8;
  StackAPI local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  luna::StackAPI::StackAPI(&local_20,in_RDI);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT>
                    (in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                     (ValueT)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  uVar3 = (undefined1)(in_stack_ffffffffffffffcc >> 0x18);
  if (bVar1) {
    this = luna::StackAPI::GetTable
                     (in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    this_00 = (StackAPI *)luna::Table::ArraySize(in_stack_ffffffffffffffd0);
    if (this_00 == (StackAPI *)0x0) {
      luna::StackAPI::PushBool((StackAPI *)0x0,(bool)uVar3);
      iVar4 = 1;
    }
    else {
      iVar4 = luna::StackAPI::GetStackSize(this_00);
      if (1 < iVar4) {
        dVar2 = luna::StackAPI::GetNumber((StackAPI *)this,(int)((ulong)this_00 >> 0x20));
        this_00 = (StackAPI *)
                  ((long)dVar2 | (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f);
      }
      uVar3 = (undefined1)((uint)iVar4 >> 0x18);
      luna::Table::EraseArrayValue
                ((Table *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 (size_t)in_RDI);
      luna::StackAPI::PushBool(this_00,(bool)uVar3);
      iVar4 = 1;
    }
  }
  else {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int Remove(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_Table, luna::ValueT_Number))
            return 0;

        auto table = api.GetTable(0);
        auto index = table->ArraySize();

        // There is no elements in array of table.
        if (index == 0)
        {
            api.PushBool(false);
            return 1;
        }

        auto params = api.GetStackSize();
        if (params > 1)
            index = static_cast<decltype(index)>(api.GetNumber(1));

        api.PushBool(table->EraseArrayValue(index));
        return 1;
    }